

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O1

void rgb_gray_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                     JSAMPARRAY output_buf,int num_rows)

{
  uint uVar1;
  _func_void_j_decompress_ptr *p_Var2;
  JSAMPROW pJVar3;
  JSAMPROW pJVar4;
  JSAMPROW pJVar5;
  JSAMPROW pJVar6;
  bool bVar7;
  ulong uVar8;
  
  if (0 < num_rows) {
    p_Var2 = cinfo->cconvert[3].start_pass;
    uVar1 = cinfo->output_width;
    do {
      if ((ulong)uVar1 != 0) {
        pJVar3 = (*input_buf)[input_row];
        pJVar4 = input_buf[1][input_row];
        pJVar5 = input_buf[2][input_row];
        pJVar6 = *output_buf;
        uVar8 = 0;
        do {
          pJVar6[uVar8] =
               (JSAMPLE)((uint)(*(int *)(p_Var2 + (ulong)pJVar4[uVar8] * 8 + 0x800) +
                                *(int *)(p_Var2 + (ulong)pJVar3[uVar8] * 8) +
                               *(int *)(p_Var2 + (ulong)pJVar5[uVar8] * 8 + 0x1000)) >> 0x10);
          uVar8 = uVar8 + 1;
        } while (uVar1 != uVar8);
      }
      input_row = input_row + 1;
      output_buf = output_buf + 1;
      bVar7 = 1 < num_rows;
      num_rows = num_rows + -1;
    } while (bVar7);
  }
  return;
}

Assistant:

METHODDEF(void)
rgb_gray_convert (j_decompress_ptr cinfo,
		  JSAMPIMAGE input_buf, JDIMENSION input_row,
		  JSAMPARRAY output_buf, int num_rows)
{
  my_cconvert_ptr cconvert = (my_cconvert_ptr) cinfo->cconvert;
  register int r, g, b;
  register INT32 * ctab = cconvert->rgb_y_tab;
  register JSAMPROW outptr;
  register JSAMPROW inptr0, inptr1, inptr2;
  register JDIMENSION col;
  JDIMENSION num_cols = cinfo->output_width;

  while (--num_rows >= 0) {
    inptr0 = input_buf[0][input_row];
    inptr1 = input_buf[1][input_row];
    inptr2 = input_buf[2][input_row];
    input_row++;
    outptr = *output_buf++;
    for (col = 0; col < num_cols; col++) {
      r = GETJSAMPLE(inptr0[col]);
      g = GETJSAMPLE(inptr1[col]);
      b = GETJSAMPLE(inptr2[col]);
      /* Y */
      outptr[col] = (JSAMPLE)
		((ctab[r+R_Y_OFF] + ctab[g+G_Y_OFF] + ctab[b+B_Y_OFF])
		 >> SCALEBITS);
    }
  }
}